

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

void nni_aio_expire_loop(void *arg)

{
  nni_list *list;
  nni_aio_cancel_fn p_Var1;
  void *pvVar2;
  nni_time nVar3;
  nni_aio *pnVar4;
  nni_aio *pnVar5;
  nng_err nVar6;
  ulong uVar7;
  uint32_t i;
  ulong uVar8;
  nni_aio *pnStack_378;
  nni_aio *expires [100];
  
  nni_thr_set_name((nni_thr *)0x0,"nng:aio:expire");
  nni_mtx_lock((nni_mtx *)arg);
  list = (nni_list *)((long)arg + 0x60);
  do {
    while( true ) {
      uVar7 = *(ulong *)((long)arg + 0x110);
      nVar3 = nni_clock();
      pnVar4 = (nni_aio *)nni_list_first(list);
      if ((pnVar4 == (nni_aio *)0x0) && (*(char *)((long)arg + 0x118) != '\0')) {
        nni_mtx_unlock((nni_mtx *)arg);
        return;
      }
      if ((uVar7 <= nVar3) || ((pnVar4 != (nni_aio *)0x0 && (*(char *)((long)arg + 0x119) != '\0')))
         ) break;
      nni_cv_until((nni_cv *)((long)arg + 0x28),uVar7);
    }
    *(undefined8 *)((long)arg + 0x110) = 0xffffffffffffffff;
    uVar7 = 0;
    while (pnVar4 != (nni_aio *)0x0) {
      if (*(char *)((long)arg + 0x119) == '\0') {
        uVar8 = pnVar4->a_expire;
        if (uVar8 < nVar3 && uVar7 < 100) goto LAB_0010dead;
LAB_0010de8d:
        if (uVar8 < *(ulong *)((long)arg + 0x110)) {
          *(ulong *)((long)arg + 0x110) = uVar8;
        }
        pnVar4 = (nni_aio *)nni_list_next(list,pnVar4);
      }
      else {
        if (99 < uVar7) {
          uVar8 = pnVar4->a_expire;
          goto LAB_0010de8d;
        }
LAB_0010dead:
        expires[uVar7 - 1] = pnVar4;
        uVar7 = uVar7 + 1;
        pnVar5 = (nni_aio *)nni_list_next(list,pnVar4);
        nni_list_remove(list,pnVar4);
        pnVar4->a_expiring = true;
        pnVar4 = pnVar5;
      }
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pnVar4 = expires[uVar8 - 1];
      if (*(char *)((long)arg + 0x119) == '\x01') {
        pnVar4->a_stop = true;
        nVar6 = NNG_ESTOPPED;
      }
      else {
        nVar6 = NNG_ETIMEDOUT;
        if (pnVar4->a_expire_ok == true) {
          pnVar4->a_expire_ok = false;
          nVar6 = NNG_OK;
        }
      }
      p_Var1 = pnVar4->a_cancel_fn;
      pvVar2 = pnVar4->a_cancel_arg;
      pnVar4->a_cancel_fn = (nni_aio_cancel_fn)0x0;
      pnVar4->a_cancel_arg = (void *)0x0;
      if (pnVar4->a_sleep == true) {
        pnVar4->a_result = nVar6;
        pnVar4->a_sleep = false;
        nni_task_dispatch(&pnVar4->a_task);
      }
      else if (p_Var1 != (nni_aio_cancel_fn)0x0) {
        nni_mtx_unlock((nni_mtx *)arg);
        (*p_Var1)(pnVar4,pvVar2,nVar6);
        nni_mtx_lock((nni_mtx *)arg);
      }
      pnVar4->a_expiring = false;
    }
    nni_cv_wake((nni_cv *)((long)arg + 0x28));
  } while( true );
}

Assistant:

static void
nni_aio_expire_loop(void *arg)
{
	nni_aio_expire_q *q   = arg;
	nni_mtx          *mtx = &q->eq_mtx;
	nni_cv           *cv  = &q->eq_cv;
	nni_time          now;
	uint32_t          exp_idx;
	nni_aio          *expires[NNI_EXPIRE_BATCH];

	nni_thr_set_name(NULL, "nng:aio:expire");

	nni_mtx_lock(mtx);

	for (;;) {
		nni_aio *aio;
		nng_err  rv;
		nni_time next;

		next = q->eq_next;
		now  = nni_clock();

		// Each time we wake up, we scan the entire list of elements.
		// We scan forward, moving up to NNI_EXPIRE_Q_SIZE elements
		// (a batch) to a saved array of things we are going to cancel.
		// This mostly runs in O(n), provided you don't have many
		// elements (> NNI_EXPIRE_Q_SIZE) all expiring simultaneously.
		aio = nni_list_first(&q->eq_list);
		if ((aio == NULL) && (q->eq_exit)) {
			nni_mtx_unlock(mtx);
			return;
		}
		if (now < next && !(q->eq_stop && aio != NULL)) {
			// nothing to do!
			nni_cv_until(cv, next);
			continue;
		}
		q->eq_next = NNI_TIME_NEVER;
		exp_idx    = 0;
		while (aio != NULL) {
			if ((q->eq_stop || aio->a_expire < now) &&
			    (exp_idx < NNI_EXPIRE_BATCH)) {
				nni_aio *nxt;

				// This one is expiring.
				expires[exp_idx++] = aio;
				// save the next node
				nxt = nni_list_next(&q->eq_list, aio);
				nni_list_remove(&q->eq_list, aio);
				// Place a temporary hold on the aio.
				// This prevents it from being destroyed.
				aio->a_expiring = true;
				aio             = nxt;
				continue;
			}
			if (aio->a_expire < q->eq_next) {
				q->eq_next = aio->a_expire;
			}
			aio = nni_list_next(&q->eq_list, aio);
		}

		for (uint32_t i = 0; i < exp_idx; i++) {
			aio = expires[i];
			if (q->eq_stop) {
				rv          = NNG_ESTOPPED;
				aio->a_stop = true;
			} else if (aio->a_expire_ok) {
				aio->a_expire_ok = false;
				rv               = 0;
			} else {
				rv = NNG_ETIMEDOUT;
			}

			nni_aio_cancel_fn cancel_fn  = aio->a_cancel_fn;
			void             *cancel_arg = aio->a_cancel_arg;

			aio->a_cancel_fn  = NULL;
			aio->a_cancel_arg = NULL;

			// We let the cancel function handle the completion.
			// If there is no cancellation function, then we cannot
			// terminate the aio - we've tried, but it has to run
			// to its natural conclusion.
			//
			// For the special case of sleeping, we don't need to
			// drop the lock and call the cancel function, we are
			// already doing it right here!
			if (aio->a_sleep) {
				aio->a_result = rv;
				aio->a_sleep  = false;
				nni_task_dispatch(&aio->a_task);
			} else if (cancel_fn != NULL) {
				nni_mtx_unlock(mtx);
				cancel_fn(aio, cancel_arg, rv);
				nni_mtx_lock(mtx);
			}
			aio->a_expiring = false;
		}
		nni_cv_wake(cv);
	}
}